

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.c
# Opt level: O2

void do_flag(CHAR_DATA *ch,char *argument)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  byte *argument_00;
  CHAR_DATA *ch_00;
  OBJ_DATA *pOVar6;
  flag_type *flag_table;
  bool *pbVar7;
  long lVar8;
  double __x;
  double dVar9;
  double dVar10;
  long *local_4858;
  char arg3 [4608];
  char arg1 [4608];
  char arg2 [4608];
  char word [4608];
  
  pcVar5 = one_argument(argument,arg1);
  pcVar5 = one_argument(pcVar5,arg2);
  argument_00 = (byte *)one_argument(pcVar5,arg3);
  bVar1 = *argument_00;
  if (((ulong)bVar1 < 0x3e) && ((0x2000280000000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
    argument_00 = (byte *)one_argument((char *)argument_00,word);
  }
  if (arg1[0] == '\0') {
LAB_002f5f45:
    send_to_char("Syntax:\n\r",ch);
    send_to_char("  flag mob  <name> <field> <+/-/=> <flags>\n\r",ch);
    send_to_char("  flag char <name> <field> <+/-/=> <flags>\n\r",ch);
    send_to_char("  flag obj  <name> <field> <+/-/=> <flags>\n\r",ch);
    send_to_char("  mob  flags: act,aff,off,imm,res,vuln,form,part\n\r",ch);
    send_to_char("  char flags: plr,comm,aff,imm,res,vuln\n\r",ch);
    send_to_char("  obj flags:  wear,extra\n\r",ch);
    send_to_char("  +: add flag, -: remove flag, = set equal to\n\r",ch);
    pcVar5 = "  otherwise flag toggles the flags listed.\n\r";
    goto LAB_002f62ac;
  }
  if (arg2[0] == '\0') {
    pcVar5 = "What do you wish to set flags on?\n\r";
    goto LAB_002f62ac;
  }
  if (arg3[0] == '\0') {
    pcVar5 = "You need to specify a flag to set.\n\r";
    goto LAB_002f62ac;
  }
  if (*argument_00 == 0) {
    pcVar5 = "Which flags do you wish to change?\n\r";
    goto LAB_002f62ac;
  }
  bVar3 = str_prefix(arg1,"mob");
  if ((bVar3) && (bVar3 = str_prefix(arg1,"char"), bVar3)) {
    bVar3 = str_prefix(arg1,"obj");
    if (bVar3) goto LAB_002f5f45;
    pOVar6 = get_obj_world(ch,arg2);
    if (pOVar6 == (OBJ_DATA *)0x0) {
      pcVar5 = "Nothing like that anywhere.\n\r";
      goto LAB_002f62ac;
    }
    bVar3 = str_prefix(arg3,"wear");
    if (bVar3) {
      bVar3 = str_prefix(arg3,"extra");
      if (bVar3) {
LAB_002f61ae:
        pcVar5 = "That\'s not an acceptable flag.\n\r";
        goto LAB_002f62ac;
      }
      local_4858 = pOVar6->extra_flags;
      flag_table = extra_flags;
    }
    else {
      local_4858 = pOVar6->wear_flags;
      flag_table = wear_flags;
    }
  }
  else {
    ch_00 = get_char_world(ch,arg2);
    if (ch_00 == (CHAR_DATA *)0x0) {
      pcVar5 = "You can\'t find them.\n\r";
      goto LAB_002f62ac;
    }
    bVar3 = str_prefix(arg3,"act");
    if (bVar3) {
      bVar3 = str_prefix(arg3,"plr");
      if (bVar3) {
        bVar3 = str_prefix(arg3,"aff");
        if (bVar3) {
          bVar3 = str_prefix(arg3,"immunity");
          if (bVar3) {
            bVar3 = str_prefix(arg3,"resist");
            if (bVar3) {
              bVar3 = str_prefix(arg3,"vuln");
              if (bVar3) {
                bVar3 = str_prefix(arg3,"off");
                if (bVar3) {
                  bVar3 = str_prefix(arg3,"form");
                  if (bVar3) {
                    bVar3 = str_prefix(arg3,"parts");
                    if (bVar3) {
                      bVar3 = str_prefix(arg3,"comm");
                      if (bVar3) goto LAB_002f61ae;
                      bVar3 = is_npc(ch_00);
                      if (bVar3) {
                        pcVar5 = "Comm can\'t be set on NPCs.\n\r";
                        goto LAB_002f62ac;
                      }
                      local_4858 = ch_00->comm;
                      flag_table = comm_flags;
                    }
                    else {
                      bVar3 = is_npc(ch_00);
                      if (!bVar3) {
                        pcVar5 = "Parts can\'t be set on PCs.\n\r";
                        goto LAB_002f62ac;
                      }
                      local_4858 = ch_00->parts;
                      flag_table = part_flags;
                    }
                  }
                  else {
                    bVar3 = is_npc(ch_00);
                    if (!bVar3) {
                      pcVar5 = "Form can\'t be set on PCs.\n\r";
                      goto LAB_002f62ac;
                    }
                    local_4858 = ch_00->form;
                    flag_table = form_flags;
                  }
                }
                else {
                  bVar3 = is_npc(ch_00);
                  if (!bVar3) {
                    pcVar5 = "OFF can\'t be set on PCs.\n\r";
                    goto LAB_002f62ac;
                  }
                  local_4858 = ch_00->off_flags;
                  flag_table = off_flags;
                }
                goto LAB_002f626d;
              }
              local_4858 = ch_00->vuln_flags;
            }
            else {
              local_4858 = ch_00->res_flags;
            }
          }
          else {
            local_4858 = ch_00->imm_flags;
          }
          flag_table = imm_flags;
        }
        else {
          local_4858 = ch_00->affected_by;
          flag_table = affect_flags;
        }
      }
      else {
        bVar3 = is_npc(ch_00);
        if (bVar3) {
          pcVar5 = "Use act for NPCs.\n\r";
          goto LAB_002f62ac;
        }
        local_4858 = ch_00->act;
        flag_table = plr_flags;
      }
    }
    else {
      bVar3 = is_npc(ch_00);
      if (!bVar3) {
        pcVar5 = "Use plr for PCs.\n\r";
        goto LAB_002f62ac;
      }
      local_4858 = ch_00->act;
      flag_table = act_flags;
    }
  }
LAB_002f626d:
  lVar8 = -99;
  pcVar5 = "That flag doesn\'t exist!\n\r";
  do {
    argument_00 = (byte *)one_argument((char *)argument_00,word);
    if (word[0] == '\0') {
      __x = (double)(lVar8 % 0x20);
      pbVar7 = &flag_table->settable;
      goto LAB_002f6301;
    }
    iVar4 = flag_lookup(word,flag_table);
    lVar8 = (long)iVar4;
  } while (iVar4 != -99);
LAB_002f62ac:
  send_to_char(pcVar5,ch);
  return;
LAB_002f6301:
  if (((flag_type *)(pbVar7 + -0x10))->name == (char *)0x0) {
    return;
  }
  iVar4 = get_trust(ch);
  if (((iVar4 == 0x3c) || (*pbVar7 == true)) && (*(long *)(pbVar7 + -8) == lVar8)) {
    if (bVar1 == 0x3d) {
LAB_002f633e:
      dVar9 = exp2(__x);
      local_4858[(int)*(long *)(pbVar7 + -8) / 0x20] =
           local_4858[(int)*(long *)(pbVar7 + -8) / 0x20] | (long)dVar9;
      pcVar5 = "You set that flag.\n\r";
    }
    else if (bVar1 == 0x2d) {
      dVar9 = exp2(__x);
      local_4858[*(long *)(pbVar7 + -8) / 0x20] =
           local_4858[*(long *)(pbVar7 + -8) / 0x20] & ~(long)dVar9;
      pcVar5 = "You removed that flag.\n\r";
    }
    else {
      if (bVar1 == 0x2b) goto LAB_002f633e;
      uVar2 = local_4858[lVar8 / 0x20];
      dVar9 = exp2(__x);
      dVar10 = exp2((double)(*(long *)(pbVar7 + -8) % 0x20));
      if ((uVar2 & (long)dVar9) == 0) {
        local_4858[(int)*(long *)(pbVar7 + -8) / 0x20] =
             local_4858[(int)*(long *)(pbVar7 + -8) / 0x20] | (long)dVar10;
        pcVar5 = "You set that flag.\n\r";
      }
      else {
        local_4858[*(long *)(pbVar7 + -8) / 0x20] =
             local_4858[*(long *)(pbVar7 + -8) / 0x20] & ~(long)dVar10;
        pcVar5 = "You removed that flag.\n\r";
      }
    }
    send_to_char(pcVar5,ch);
  }
  pbVar7 = pbVar7 + 0x18;
  goto LAB_002f6301;
}

Assistant:

void do_flag(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH], arg2[MAX_INPUT_LENGTH], arg3[MAX_INPUT_LENGTH];
	char word[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	long *flag = 0;
	long pos, pos2 = NO_FLAG;
	char type;
	const struct flag_type *flag_table;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	argument = one_argument(argument, arg3);

	type = argument[0];

	if (type == '=' || type == '-' || type == '+')
		argument = one_argument(argument, word);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  flag mob  <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  flag char <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  flag obj  <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  mob  flags: act,aff,off,imm,res,vuln,form,part\n\r", ch);
		send_to_char("  char flags: plr,comm,aff,imm,res,vuln\n\r", ch);
		send_to_char("  obj flags:  wear,extra\n\r", ch);
		send_to_char("  +: add flag, -: remove flag, = set equal to\n\r", ch);
		send_to_char("  otherwise flag toggles the flags listed.\n\r", ch);
		return;
	}

	if (arg2[0] == '\0')
	{
		send_to_char("What do you wish to set flags on?\n\r", ch);
		return;
	}

	if (arg3[0] == '\0')
	{
		send_to_char("You need to specify a flag to set.\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		send_to_char("Which flags do you wish to change?\n\r", ch);
		return;
	}

	if (!str_prefix(arg1, "mob") || !str_prefix(arg1, "char"))
	{
		victim = get_char_world(ch, arg2);
		if (victim == nullptr)
		{
			send_to_char("You can't find them.\n\r", ch);
			return;
		}

		/* select a flag to set */
		if (!str_prefix(arg3, "act"))
		{
			if (!is_npc(victim))
			{
				send_to_char("Use plr for PCs.\n\r", ch);
				return;
			}

			flag = &victim->act[0];
			flag_table = act_flags;
		}
		else if (!str_prefix(arg3, "plr"))
		{
			if (is_npc(victim))
			{
				send_to_char("Use act for NPCs.\n\r", ch);
				return;
			}

			flag = &victim->act[0];
			flag_table = plr_flags;
		}
		else if (!str_prefix(arg3, "aff"))
		{
			flag = &victim->affected_by[0];
			flag_table = affect_flags;
		}
		else if (!str_prefix(arg3, "immunity"))
		{
			flag = &victim->imm_flags[0];
			flag_table = imm_flags;
		}
		else if (!str_prefix(arg3, "resist"))
		{
			flag = &victim->res_flags[0];
			flag_table = imm_flags;
		}
		else if (!str_prefix(arg3, "vuln"))
		{
			flag = &victim->vuln_flags[0];
			flag_table = imm_flags;
		}
		else if (!str_prefix(arg3, "off"))
		{
			if (!is_npc(victim))
			{
				send_to_char("OFF can't be set on PCs.\n\r", ch);
				return;
			}

			flag = &victim->off_flags[0];
			flag_table = off_flags;
		}
		else if (!str_prefix(arg3, "form"))
		{
			if (!is_npc(victim))
			{
				send_to_char("Form can't be set on PCs.\n\r", ch);
				return;
			}

			flag = &victim->form[0];
			flag_table = form_flags;
		}
		else if (!str_prefix(arg3, "parts"))
		{
			if (!is_npc(victim))
			{
				send_to_char("Parts can't be set on PCs.\n\r", ch);
				return;
			}

			flag = &victim->parts[0];
			flag_table = part_flags;
		}
		else if (!str_prefix(arg3, "comm"))
		{
			if (is_npc(victim))
			{
				send_to_char("Comm can't be set on NPCs.\n\r", ch);
				return;
			}
			flag = &victim->comm[0];
			flag_table = comm_flags;
		}
		else
		{
			send_to_char("That's not an acceptable flag.\n\r", ch);
			return;
		}
	}
	else if (!str_prefix(arg1, "obj"))
	{
		if ((obj = get_obj_world(ch, arg2)) == nullptr)
		{
			send_to_char("Nothing like that anywhere.\n\r", ch);
			return;
		}

		/* select a flag to set */
		if (!str_prefix(arg3, "wear"))
		{
			flag = &obj->wear_flags[0];
			flag_table = wear_flags;
		}
		else if (!str_prefix(arg3, "extra"))
		{
			flag = &obj->extra_flags[0];
			flag_table = extra_flags;
		}
		else
		{
			send_to_char("That's not an acceptable flag.\n\r", ch);
			return;
		}
	}
	else
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  flag mob  <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  flag char <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  flag obj  <name> <field> <+/-/=> <flags>\n\r", ch);
		send_to_char("  mob  flags: act,aff,off,imm,res,vuln,form,part\n\r", ch);
		send_to_char("  char flags: plr,comm,aff,imm,res,vuln\n\r", ch);
		send_to_char("  obj flags:  wear,extra\n\r", ch);
		send_to_char("  +: add flag, -: remove flag, = set equal to\n\r", ch);
		send_to_char("  otherwise flag toggles the flags listed.\n\r", ch);
		return;
	}

	/* mark the words */
	for (;;)
	{
		argument = one_argument(argument, word);

		if (word[0] == '\0')
			break;

		pos2 = flag_lookup(word, flag_table);

		if (pos2 == NO_FLAG)
		{
			send_to_char("That flag doesn't exist!\n\r", ch);
			return;
		}
	}

	for (pos = 0; flag_table[pos].name != nullptr; pos++)
	{
		if ((get_trust(ch) == MAX_LEVEL || flag_table[pos].settable) && flag_table[pos].bit == pos2)
		{
			switch (type)
			{
				case '=':
				case '+':
					SET_BIT(flag, flag_table[pos].bit);
					send_to_char("You set that flag.\n\r", ch);
					break;
				case '-':
					REMOVE_BIT(flag, flag_table[pos].bit);
					send_to_char("You removed that flag.\n\r", ch);
					break;
				default:
					if (IS_SET(flag, flag_table[pos].bit))
					{
						REMOVE_BIT(flag, flag_table[pos].bit);
						send_to_char("You removed that flag.\n\r", ch);
					}
					else
					{
						SET_BIT(flag, flag_table[pos].bit);
						send_to_char("You set that flag.\n\r", ch);
					}
			}
		}
		else
		{
			continue;
		}
	}
}